

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::NegativeVertexAttribDivisor::Run(NegativeVertexAttribDivisor *this)

{
  GLenum GVar1;
  int local_1c;
  NegativeVertexAttribDivisor *pNStack_18;
  GLint p;
  NegativeVertexAttribDivisor *this_local;
  
  pNStack_18 = this;
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8869,&local_1c);
  glu::CallLogWrapper::glVertexBindingDivisor
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_1c + 1,1);
  GVar1 = glu::CallLogWrapper::glGetError
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  if (GVar1 == 0x501) {
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glVertexBindingDivisor
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,1);
    GVar1 = glu::CallLogWrapper::glGetError
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar1 == 0x502) {
      this_local = (NegativeVertexAttribDivisor *)0x0;
    }
    else {
      anon_unknown_0::Output("INVALID_OPERATION should be generated (default VAO).\n");
      this_local = (NegativeVertexAttribDivisor *)&DAT_ffffffffffffffff;
    }
  }
  else {
    anon_unknown_0::Output
              (
              "INVALID_VALUE should be generated (bindingIndex greater than GL_MAX_VERTEX_ATTRIBS).\n"
              );
    this_local = (NegativeVertexAttribDivisor *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		/*
		 Errors
		 An INVALID_VALUE error is generated if index is greater than or equal to
		 the value of MAX_VERTEX_ATTRIBS.
		 An INVALID_OPERATION error is generated if no vertex array object is
		 bound.
		 */
		glBindVertexArray(m_vao);
		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &p);
		glVertexBindingDivisor(p + 1, 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated (bindingIndex greater than GL_MAX_VERTEX_ATTRIBS).\n");
			return ERROR;
		}
		glBindVertexArray(0);
		glVertexBindingDivisor(0, 1);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated (default VAO).\n");
			return ERROR;
		}
		return NO_ERROR;
	}